

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3StrAccumAppend(StrAccum *p,char *z,int N)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *__dest;
  int nBytes;
  long lVar4;
  uint uVar5;
  
  if (p->mallocFailed == '\0' && p->tooBig == '\0') {
    if (N < 0) {
      if (z == (char *)0x0) {
        return;
      }
      uVar5 = 0xffffffff;
      pcVar3 = z;
      do {
        uVar5 = uVar5 + 1;
        cVar1 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (cVar1 != '\0');
      N = uVar5 & 0x3fffffff;
    }
    if (z == (char *)0x0 || N == 0) {
      return;
    }
    uVar5 = p->nChar;
    if (p->nAlloc <= (int)(uVar5 + N)) {
      if (p->useMalloc == '\0') {
        p->tooBig = '\x01';
        N = p->nAlloc + ~uVar5;
        if (N < 1) {
          return;
        }
      }
      else {
        pcVar3 = (char *)0x0;
        if (p->zText != p->zBase) {
          pcVar3 = p->zText;
        }
        lVar4 = (ulong)(uint)N + (long)(int)uVar5 + 1;
        if (p->mxAlloc < lVar4) {
          sqlite3StrAccumReset(p);
          p->tooBig = '\x01';
          return;
        }
        nBytes = (int)lVar4;
        p->nAlloc = nBytes;
        if (p->useMalloc == '\x01') {
          __dest = (char *)sqlite3DbRealloc(p->db,pcVar3,nBytes);
        }
        else {
          iVar2 = sqlite3_initialize();
          if (iVar2 != 0) goto LAB_00129760;
          __dest = (char *)sqlite3Realloc(pcVar3,nBytes);
        }
        if (__dest == (char *)0x0) {
LAB_00129760:
          p->mallocFailed = '\x01';
          sqlite3StrAccumReset(p);
          return;
        }
        uVar5 = p->nChar;
        if (0 < (int)uVar5 && pcVar3 == (char *)0x0) {
          memcpy(__dest,p->zText,(ulong)uVar5);
          uVar5 = p->nChar;
        }
        p->zText = __dest;
      }
    }
    memcpy(p->zText + (int)uVar5,z,(ulong)(uint)N);
    p->nChar = p->nChar + N;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3StrAccumAppend(StrAccum *p, const char *z, int N){
  assert( z!=0 || N==0 );
  if( p->tooBig | p->mallocFailed ){
    testcase(p->tooBig);
    testcase(p->mallocFailed);
    return;
  }
  assert( p->zText!=0 || p->nChar==0 );
  if( N<0 ){
    N = sqlite3Strlen30(z);
  }
  if( N==0 || NEVER(z==0) ){
    return;
  }
  if( p->nChar+N >= p->nAlloc ){
    char *zNew;
    if( !p->useMalloc ){
      p->tooBig = 1;
      N = p->nAlloc - p->nChar - 1;
      if( N<=0 ){
        return;
      }
    }else{
      char *zOld = (p->zText==p->zBase ? 0 : p->zText);
      i64 szNew = p->nChar;
      szNew += N + 1;
      if( szNew > p->mxAlloc ){
        sqlite3StrAccumReset(p);
        p->tooBig = 1;
        return;
      }else{
        p->nAlloc = (int)szNew;
      }
      if( p->useMalloc==1 ){
        zNew = sqlite3DbRealloc(p->db, zOld, p->nAlloc);
      }else{
        zNew = sqlite3_realloc(zOld, p->nAlloc);
      }
      if( zNew ){
        if( zOld==0 && p->nChar>0 ) memcpy(zNew, p->zText, p->nChar);
        p->zText = zNew;
      }else{
        p->mallocFailed = 1;
        sqlite3StrAccumReset(p);
        return;
      }
    }
  }
  assert( p->zText );
  memcpy(&p->zText[p->nChar], z, N);
  p->nChar += N;
}